

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Temporary.cpp
# Opt level: O2

void __thiscall IRT::Temporary::Temporary(Temporary *this)

{
  int __val;
  string local_38;
  
  __val = counter_;
  counter_ = counter_ + 1;
  std::__cxx11::to_string(&local_38,__val);
  std::operator+(&this->name_,"%",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

IRT::Temporary::Temporary(): name_("%" + std::to_string(counter_++)) {

}